

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-array.h
# Opt level: O1

SignalArray_const<int> * __thiscall
dynamicgraph::SignalArray<int>::operator<<
          (SignalArray_const<int> *__return_storage_ptr__,SignalArray<int> *this,
          SignalBase<int> *sig)

{
  SignalArray_const<int>::SignalArray_const(__return_storage_ptr__,this);
  SignalArray_const<int>::addElmt(__return_storage_ptr__,sig);
  return __return_storage_ptr__;
}

Assistant:

virtual SignalArray_const<Time> operator<<(
      const SignalBase<Time> &sig) const {
    SignalArray_const<Time> res(*this);
    res << sig;
    return res;
  }